

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
          (QHash<FileInfoCacheKey,_QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  long lVar1;
  FileInfoCacheKey *in_RDX;
  QHash<FileInfoCacheKey,_QFileInfo> *in_RSI;
  FileInfoCacheKey *in_RDI;
  long in_FS_OFFSET;
  piter pVar2;
  FileInfoCacheKey copy;
  FileInfoCacheKey *in_stack_ffffffffffffff68;
  QFileInfo *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FileInfoCacheKey::FileInfoCacheKey(in_RDI,in_stack_ffffffffffffff68);
  pVar2 = (piter)emplace<QFileInfo_const&>(in_RSI,in_RDX,in_stack_ffffffffffffff88);
  FileInfoCacheKey::~FileInfoCacheKey(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }